

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptArrays.cpp
# Opt level: O3

void __thiscall
GlobOpt::ArraySrcOpt::UpdateValue
          (ArraySrcOpt *this,StackSym *newHeadSegmentSym,StackSym *newHeadSegmentLengthSym,
          StackSym *newLengthSym)

{
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  ObjectType OVar4;
  undefined4 *puVar5;
  ArrayValueInfo *pAVar6;
  
  OVar3 = ValueType::GetObjectType(&this->baseValueType);
  OVar4 = ValueType::GetObjectType(&this->newBaseValueType);
  if (OVar3 != OVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                       ,0xf5,"(baseValueType.GetObjectType() == newBaseValueType.GetObjectType())",
                       "baseValueType.GetObjectType() == newBaseValueType.GetObjectType()");
    if (!bVar2) goto LAB_0047f083;
    *puVar5 = 0;
  }
  bVar2 = ValueType::IsObject(&this->newBaseValueType);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                       ,0xf6,"(newBaseValueType.IsObject())","newBaseValueType.IsObject()");
    if (!bVar2) goto LAB_0047f083;
    *puVar5 = 0;
  }
  bVar2 = ValueType::IsLikelyArray(&this->baseValueType);
  if ((newLengthSym == (StackSym *)0x0) || (bVar2)) {
    if ((newHeadSegmentSym == (StackSym *)0x0 && newHeadSegmentLengthSym == (StackSym *)0x0) &&
        newLengthSym == (StackSym *)0x0) {
      ChangeValueType(this->globOpt,this->globOpt->currentBlock,this->baseValue,
                      (ValueType)
                      *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                       &(this->newBaseValueType).field_0.field_0,true,false);
      return;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                       ,0xf7,"(baseValueType.IsLikelyArray() || !newLengthSym)",
                       "baseValueType.IsLikelyArray() || !newLengthSym");
    if (!bVar2) goto LAB_0047f083;
    *puVar5 = 0;
  }
  pAVar6 = this->baseArrayValueInfo;
  if (pAVar6 != (ArrayValueInfo *)0x0) {
    if (newHeadSegmentSym == (StackSym *)0x0) {
      newHeadSegmentSym = pAVar6->headSegmentSym;
    }
    if (newHeadSegmentLengthSym == (StackSym *)0x0) {
      newHeadSegmentLengthSym = pAVar6->headSegmentLengthSym;
    }
    if (newLengthSym == (StackSym *)0x0) {
      newLengthSym = pAVar6->lengthSym;
    }
    if (newHeadSegmentSym != pAVar6->headSegmentSym && pAVar6->headSegmentSym != (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                         ,0x113,
                         "(!baseArrayValueInfo->HeadSegmentSym() || newHeadSegmentSym == baseArrayValueInfo->HeadSegmentSym())"
                         ,
                         "!baseArrayValueInfo->HeadSegmentSym() || newHeadSegmentSym == baseArrayValueInfo->HeadSegmentSym()"
                        );
      if (!bVar2) goto LAB_0047f083;
      *puVar5 = 0;
      pAVar6 = this->baseArrayValueInfo;
    }
    if ((pAVar6->headSegmentLengthSym != (StackSym *)0x0) &&
       (newHeadSegmentLengthSym != pAVar6->headSegmentLengthSym)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                         ,0x114,
                         "(!baseArrayValueInfo->HeadSegmentLengthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym())"
                         ,
                         "!baseArrayValueInfo->HeadSegmentLengthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym()"
                        );
      if (!bVar2) goto LAB_0047f083;
      *puVar5 = 0;
      pAVar6 = this->baseArrayValueInfo;
    }
    if ((pAVar6->lengthSym != (StackSym *)0x0) && (newLengthSym != pAVar6->lengthSym)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                         ,0x115,
                         "(!baseArrayValueInfo->LengthSym() || newLengthSym == baseArrayValueInfo->LengthSym())"
                         ,
                         "!baseArrayValueInfo->LengthSym() || newLengthSym == baseArrayValueInfo->LengthSym()"
                        );
      if (!bVar2) {
LAB_0047f083:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  pAVar6 = ArrayValueInfo::New(this->globOpt->alloc,
                               (ValueType)
                               *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                &(this->newBaseValueType).field_0.field_0,newHeadSegmentSym,
                               newHeadSegmentLengthSym,newLengthSym,this->baseValueInfo->symStore);
  ChangeValueInfo(this->globOpt,this->globOpt->currentBlock,this->baseValue,&pAVar6->super_ValueInfo
                  ,false,false);
  return;
}

Assistant:

void GlobOpt::ArraySrcOpt::UpdateValue(StackSym * newHeadSegmentSym, StackSym * newHeadSegmentLengthSym, StackSym * newLengthSym)
{
    Assert(baseValueType.GetObjectType() == newBaseValueType.GetObjectType());
    Assert(newBaseValueType.IsObject());
    Assert(baseValueType.IsLikelyArray() || !newLengthSym);

    if (!(newHeadSegmentSym || newHeadSegmentLengthSym || newLengthSym))
    {
        // We're not adding new information to the value other than changing the value type. Preserve any existing
        // information and just change the value type.
        globOpt->ChangeValueType(globOpt->currentBlock, baseValue, newBaseValueType, true);
        return;
    }

    // Merge the new syms into the value while preserving any existing information, and change the value type
    if (baseArrayValueInfo)
    {
        if (!newHeadSegmentSym)
        {
            newHeadSegmentSym = baseArrayValueInfo->HeadSegmentSym();
        }

        if (!newHeadSegmentLengthSym)
        {
            newHeadSegmentLengthSym = baseArrayValueInfo->HeadSegmentLengthSym();
        }

        if (!newLengthSym)
        {
            newLengthSym = baseArrayValueInfo->LengthSym();
        }

        Assert(!baseArrayValueInfo->HeadSegmentSym() || newHeadSegmentSym == baseArrayValueInfo->HeadSegmentSym());
        Assert(!baseArrayValueInfo->HeadSegmentLengthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym());
        Assert(!baseArrayValueInfo->LengthSym() || newLengthSym == baseArrayValueInfo->LengthSym());
    }

    ArrayValueInfo *const newBaseArrayValueInfo =
        ArrayValueInfo::New(
            globOpt->alloc,
            newBaseValueType,
            newHeadSegmentSym,
            newHeadSegmentLengthSym,
            newLengthSym,
            baseValueInfo->GetSymStore());

    globOpt->ChangeValueInfo(globOpt->currentBlock, baseValue, newBaseArrayValueInfo);
}